

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Type __thiscall wabt::LocalTypes::operator[](LocalTypes *this,Index i)

{
  pointer ppVar1;
  pointer ppVar2;
  Type in_EAX;
  uint uVar3;
  pointer ppVar4;
  uint uVar5;
  bool bVar6;
  
  ppVar1 = (this->decls_).
           super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->decls_).
           super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = ppVar1 == ppVar2;
  if (bVar6) {
    uVar5 = 0;
  }
  else {
    in_EAX = ppVar1->first;
    uVar5 = 0;
    uVar3 = ppVar1->second;
    if (ppVar1->second <= i) {
      do {
        uVar5 = uVar3;
        ppVar4 = ppVar1 + 1;
        bVar6 = ppVar4 == ppVar2;
        if (bVar6) goto LAB_00f5b709;
        uVar3 = ppVar1[1].second + uVar5;
        ppVar1 = ppVar4;
      } while (uVar3 <= i);
      in_EAX = ppVar4->first;
    }
  }
LAB_00f5b709:
  if ((bVar6) && (in_EAX = Any, uVar5 <= i)) {
    __assert_fail("i < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.cc"
                  ,0xc1,"Type wabt::LocalTypes::operator[](Index) const");
  }
  return in_EAX;
}

Assistant:

Type LocalTypes::operator[](Index i) const {
  Index count = 0;
  for (auto decl: decls_) {
    if (i < count + decl.second) {
      return decl.first;
    }
    count += decl.second;
  }
  assert(i < count);
  return Type::Any;
}